

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

poly_copy_descr *
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::poly_uninitialized_move
          (poly_copy_descr *__return_storage_ptr__,my_base *a,void_pointer dst_ptr,
          elem_ptr_const_pointer begin,elem_ptr_const_pointer _free,elem_ptr_const_pointer end,
          size_t max_align)

{
  void *pvVar1;
  difference_type dVar2;
  void_pointer pvVar3;
  policy_t *p;
  allocator_type *paVar4;
  pointer pIVar5;
  size_t sVar6;
  allocator<Interface> local_69;
  vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
  *local_68;
  elem_ptr_const_pointer elem;
  elem_ptr_pointer elem_dst;
  void_pointer dst_storage;
  elem_ptr_pointer storage_begin;
  elem_ptr_pointer dst;
  elem_ptr_pointer dst_begin;
  elem_ptr_const_pointer end_local;
  elem_ptr_const_pointer _free_local;
  elem_ptr_const_pointer begin_local;
  void_pointer dst_ptr_local;
  my_base *a_local;
  
  storage_begin = (elem_ptr_pointer)dst_ptr;
  dst = (elem_ptr_pointer)dst_ptr;
  dst_begin = end;
  end_local = _free;
  _free_local = begin;
  begin_local = (elem_ptr_const_pointer)dst_ptr;
  dst_ptr_local = a;
  a_local = (my_base *)__return_storage_ptr__;
  dVar2 = std::
          distance<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<std::allocator<Interface>>>const*>
                    (begin,end);
  elem_dst = (elem_ptr_pointer)((long)dst_ptr + dVar2 * 0x28);
  dst_storage = elem_dst;
  for (elem = dst; elem != (elem_ptr_const_pointer)dst_storage; elem = elem + 1) {
    vector_impl::allocator_base<std::allocator<unsigned_char>>::
    construct<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<std::allocator<Interface>>>*>
              ((allocator_base<std::allocator<unsigned_char>> *)dst_ptr_local,elem);
  }
  for (local_68 = _free_local; local_68 != end_local; local_68 = local_68 + 1) {
    vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
    ::operator=(storage_begin,local_68);
    pvVar3 = next_aligned_storage(elem_dst,max_align);
    (storage_begin->ptr).first = pvVar3;
    p = vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
        ::policy(local_68);
    paVar4 = vector_impl::allocator_base<std::allocator<unsigned_char>_>::get_allocator_ref
                       ((allocator_base<std::allocator<unsigned_char>_> *)dst_ptr_local);
    std::allocator<Interface>::allocator<unsigned_char>(&local_69,paVar4);
    pIVar5 = vector_impl::
             cloning_policy_traits<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_Interface,_std::allocator<Interface>_>
             ::move(p,&local_69,(local_68->ptr).second,(storage_begin->ptr).first);
    (storage_begin->ptr).second = pIVar5;
    std::allocator<Interface>::~allocator(&local_69);
    pvVar1 = (storage_begin->ptr).first;
    sVar6 = vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
            ::size(storage_begin);
    elem_dst = (elem_ptr_pointer)((long)pvVar1 + sVar6);
    storage_begin = storage_begin + 1;
  }
  std::
  make_tuple<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<std::allocator<Interface>>>*&,poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<std::allocator<Interface>>>*const&,void*&>
            (__return_storage_ptr__,&storage_begin,
             (vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
              **)&dst_storage,&elem_dst);
  return __return_storage_ptr__;
}

Assistant:

inline auto vector<IF, Allocator, CloningPolicy>::poly_uninitialized_move(my_base& a,
    void_pointer dst_ptr, elem_ptr_const_pointer begin, elem_ptr_const_pointer _free,
    elem_ptr_const_pointer end, size_t max_align) noexcept -> poly_copy_descr
{
    const auto   dst_begin     = static_cast<elem_ptr_pointer>(dst_ptr);
    auto         dst           = dst_begin;
    const auto   storage_begin = dst_begin + std::distance(begin, end);
    void_pointer dst_storage   = storage_begin;
    for (auto elem_dst = dst_begin; elem_dst != storage_begin; ++elem_dst) {
        a.construct(elem_dst);
    }
    for (auto elem = begin; elem != _free; ++elem, ++dst) {
        *dst            = *elem;
        dst->ptr.first  = next_aligned_storage(dst_storage, max_align);
        dst->ptr.second = cloning_policy_traits::move(
            elem->policy(), a.get_allocator_ref(), elem->ptr.second, dst->ptr.first);
        dst_storage = static_cast<pointer>(dst->ptr.first) + dst->size();
    }
    return std::make_tuple(dst, storage_begin, dst_storage);
}